

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface_ProblemToPolicyDiscretePure.h
# Opt level: O1

LIndex __thiscall
Interface_ProblemToPolicyDiscretePure::GetNrPolicies
          (Interface_ProblemToPolicyDiscretePure *this,Index ag,PolicyDomainCategory cat,
          size_t depth)

{
  long lVar1;
  long lVar2;
  EOverflow *this_00;
  LIndex LVar3;
  LIndex LVar4;
  
  lVar1 = (**(code **)(*(long *)this + 0x28))();
  LVar3 = 1;
  if (lVar1 != 0) {
    lVar1 = 0;
    LVar4 = LVar3;
    do {
      lVar2 = (**(code **)(*(long *)this + 0x20))(this,ag);
      LVar3 = lVar2 * LVar4;
      if (LVar3 < LVar4) {
        this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
        EOverflow::EOverflow
                  (this_00,
                   "Interface_ProblemToPolicyDiscretePure::GetNrPolicies() overflow detected");
        __cxa_throw(this_00,&EOverflow::typeinfo,E::~E);
      }
      lVar1 = lVar1 + 1;
      lVar2 = (**(code **)(*(long *)this + 0x28))(this,ag,cat,depth);
      LVar4 = LVar3;
    } while (lVar1 != lVar2);
  }
  return LVar3;
}

Assistant:

LIndex GetNrPolicies(Index ag,
                             PolicyGlobals::PolicyDomainCategory cat, 
                             size_t depth=MAXHORIZON) const
        {        
#if 0 // don't use powl(), we want to detect overflow
            LIndex nr_pols = 
                static_cast<LIndex>(
                    powl( GetNrActions(ag),
                          GetNrPolicyDomainElements(ag,cat,depth) ));
#endif
            LIndex nrPols=1;
            for(size_t k=0;k!=GetNrPolicyDomainElements(ag,cat,depth);++k)
            {
                LIndex nrPolsOld=nrPols;
                nrPols*=GetNrActions(ag);
                if(nrPols<nrPolsOld)
                    throw(EOverflow("Interface_ProblemToPolicyDiscretePure::GetNrPolicies() overflow detected"));
            }
            return(nrPols);
        }